

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.h
# Opt level: O3

void __thiscall L15_4::LabeledSales::~LabeledSales(LabeledSales *this)

{
  pointer pcVar1;
  
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_00134af0;
  pcVar1 = (this->_label)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_label).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~LabeledSales() {}